

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O2

bool __thiscall bssl::SSLTranscript::HashBuffer(SSLTranscript *this,EVP_MD_CTX *ctx,EVP_MD *digest)

{
  _Head_base<0UL,_buf_mem_st_*,_false> _Var1;
  int iVar2;
  size_t cnt;
  uint8_t *d;
  CBS buf;
  CBS header;
  
  iVar2 = EVP_DigestInit_ex((EVP_MD_CTX *)ctx,(EVP_MD *)digest,(ENGINE *)0x0);
  if (iVar2 == 0) {
    return false;
  }
  _Var1._M_head_impl =
       (this->buffer_)._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
  if (((this->field_0x28 & 1) == 0) || (this->version_ < 0x304)) {
    cnt = (_Var1._M_head_impl)->length;
    d = (uint8_t *)(_Var1._M_head_impl)->data;
  }
  else {
    buf.len = (_Var1._M_head_impl)->length;
    if (buf.len == 0) {
      return true;
    }
    buf.data = (uint8_t *)(_Var1._M_head_impl)->data;
    iVar2 = CBS_get_bytes(&buf,&header,4);
    if (((iVar2 == 0) || (iVar2 = CBS_skip(&buf,8), iVar2 == 0)) ||
       (iVar2 = EVP_DigestUpdate((EVP_MD_CTX *)ctx,header.data,header.len), cnt = buf.len,
       d = buf.data, iVar2 == 0)) {
      return false;
    }
  }
  iVar2 = EVP_DigestUpdate((EVP_MD_CTX *)ctx,d,cnt);
  return iVar2 != 0;
}

Assistant:

bool SSLTranscript::HashBuffer(EVP_MD_CTX *ctx, const EVP_MD *digest) const {
  if (!EVP_DigestInit_ex(ctx, digest, nullptr)) {
    return false;
  }
  if (!is_dtls_ || version_ < TLS1_3_VERSION) {
    return EVP_DigestUpdate(ctx, buffer_->data, buffer_->length);
  }

  // If the version is DTLS 1.3 and we still have a buffer, then there should be
  // at most a single DTLSHandshake message in the buffer, for the ClientHello.
  // On the server side, the version (DTLS 1.3) and cipher suite are chosen in
  // response to the first ClientHello, and InitHash is called before that
  // ClientHello is added to the SSLTranscript, so the buffer is empty if this
  // SSLTranscript is on the server.
  if (buffer_->length == 0) {
    return true;
  }

  // On the client side, we can receive either a ServerHello or
  // HelloRetryRequest in response to the ClientHello. Regardless of which
  // message we receive, the client code calls InitHash before updating the
  // transcript with that message, so the ClientHello is the only message in the
  // buffer. In DTLS 1.3, we need to skip the message_seq, fragment_offset, and
  // fragment_length fields from the DTLSHandshake message in the buffer. The
  // structure of a DTLSHandshake message is as follows (RFC 9147, section 5.2):
  //
  //   struct {
  //       HandshakeType msg_type;    /* handshake type */
  //       uint24 length;             /* bytes in message */
  //       uint16 message_seq;        /* DTLS-required field */
  //       uint24 fragment_offset;    /* DTLS-required field */
  //       uint24 fragment_length;    /* DTLS-required field */
  //       select (msg_type) {
  //         /* omitted for brevity */
  //       } body;
  //   } DTLSHandshake;
  CBS buf, header;
  CBS_init(&buf, reinterpret_cast<uint8_t *>(buffer_->data), buffer_->length);
  if (!CBS_get_bytes(&buf, &header, 4) ||                             //
      !CBS_skip(&buf, 8) ||                                           //
      !EVP_DigestUpdate(ctx, CBS_data(&header), CBS_len(&header)) ||  //
      !EVP_DigestUpdate(ctx, CBS_data(&buf), CBS_len(&buf))) {
    return false;
  }
  return true;
}